

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O2

void expr_table(LexState *ls,ExpDesc *e)

{
  BCLine line;
  MSize MVar1;
  FuncState *fs;
  TValue TVar2;
  ExpKind EVar3;
  bool bVar4;
  BCPos BVar5;
  uint uVar6;
  LexToken LVar7;
  BCReg BVar8;
  int iVar9;
  uint uVar10;
  BCReg BVar11;
  GCstr *pGVar12;
  GCobj *gc;
  TValue *pTVar13;
  ulong uVar14;
  uint32_t hbits;
  long lVar15;
  bool bVar16;
  uint32_t asize;
  GCobj *o;
  BCInsLine *pBVar17;
  uint uVar18;
  TValue local_88;
  uint uStack_80;
  undefined4 uStack_7c;
  undefined4 uStack_78;
  int local_70;
  BCReg local_6c;
  TValue k;
  ExpDesc val;
  
  fs = ls->fs;
  line = ls->linenumber;
  BVar11 = fs->freereg;
  BVar5 = bcemit_INS(fs,BVar11 * 0x100 + 0x34);
  e->k = VNONRELOC;
  (e->u).s.info = BVar11;
  e->t = 0xffffffff;
  e->f = 0xffffffff;
  bcreg_reserve(fs,1);
  local_6c = BVar11 + 1;
  lex_check(ls,0x7b);
  uVar6 = 0;
  uVar18 = 1;
  local_70 = 0;
  bVar4 = false;
  bVar16 = false;
  gc = (GCobj *)0x0;
  do {
    do {
      iVar9 = ls->tok;
      if (iVar9 == 0x7d) goto LAB_00124dad;
      if ((iVar9 == 0x11f) || (iVar9 == 0x10a)) {
        LVar7 = lj_lex_lookahead(ls);
        if (LVar7 == 0x3d) {
          uStack_80 = 3;
          uStack_7c = 0xffffffff;
          local_88.u32.lo = 0;
          uStack_78 = 0xffffffff;
          pGVar12 = lex_str(ls);
          local_88.u32.lo = (uint32_t)pGVar12;
          local_88.field_2.it = (uint32_t)((ulong)pGVar12 >> 0x20);
          lex_check(ls,0x3d);
          uVar6 = uVar6 + 1;
          goto LAB_00124ba9;
        }
LAB_00124bad:
        uStack_80 = 4;
        uStack_7c = 0xffffffff;
        uStack_78 = 0xffffffff;
        local_88.n = (lua_Number)(int)uVar18;
        uVar18 = uVar18 + 1;
        bVar4 = true;
        bVar16 = bVar4;
      }
      else {
        if (iVar9 != 0x5b) goto LAB_00124bad;
        expr_bracket(ls,(ExpDesc *)&local_88.field_2);
        if (4 < uStack_80) {
          expr_index(fs,e,(ExpDesc *)&local_88.field_2);
        }
        if ((uStack_80 == 4) && (ABS((double)local_88.u64) == 0.0)) {
          bVar4 = true;
        }
        else {
          uVar6 = uVar6 + 1;
        }
        lex_check(ls,0x3d);
LAB_00124ba9:
        bVar16 = false;
      }
      expr(ls,&val);
      if ((uStack_80 - 1 < 4) && ((uStack_80 == 3 || ((val.k < VKCDATA && (val.t == val.f)))))) {
        if (gc == (GCobj *)0x0) {
          asize = uVar18;
          if (!bVar4) {
            asize = 0;
          }
          uVar10 = 0x1f;
          if (uVar6 - 1 != 0) {
            for (; uVar6 - 1 >> uVar10 == 0; uVar10 = uVar10 - 1) {
            }
          }
          hbits = (uVar10 ^ 0xffffffe0) + 0x21;
          if (uVar6 < 2) {
            hbits = uVar6;
          }
          gc = (GCobj *)lj_tab_new(fs->L,asize,hbits);
          BVar8 = const_gc(fs,gc,0xfffffff4);
          fs->bcbase[BVar5].ins = BVar8 << 0x10 | BVar11 * 0x100 | 0x35;
        }
        if (uStack_80 < 3) {
          k.field_2.it = ~uStack_80;
        }
        else {
          k = local_88;
          if (uStack_80 == 3) {
            k.field_2.it = 0xfffffffb;
            k.u32.lo = local_88.u32.lo;
          }
        }
        pTVar13 = lj_tab_set(fs->L,&gc->tab,&k);
        if (((gc->gch).marked & 4) != 0) {
          uVar14 = (ulong)(fs->L->glref).ptr32;
          (gc->gch).marked = (gc->gch).marked & 0xfb;
          (gc->gch).gclist.gcptr32 = *(uint32_t *)(uVar14 + 0x6c);
          *(uint32_t *)(uVar14 + 0x6c) = (uint32_t)gc;
        }
        if ((VKLAST < val.k) || (val.t != val.f)) {
          (pTVar13->u32).lo = (uint32_t)gc;
          (pTVar13->field_2).it = 0xfffffff4;
          bVar16 = false;
          local_70 = 1;
          goto LAB_00124cf7;
        }
        if (val.k < VKSTR) {
          (pTVar13->field_2).it = ~val.k;
        }
        else if (val.k == VKSTR) {
          (pTVar13->field_2).field_0 =
               (anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0)val.u.s.info;
          (pTVar13->field_2).it = 0xfffffffb;
        }
        else {
          TVar2.field_2.it = val.u.s.aux;
          TVar2.field_2.field_0 =
               (anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0)val.u.s.info;
          *pTVar13 = TVar2;
        }
        bVar16 = false;
      }
      else {
LAB_00124cf7:
        if (val.k != VCALL) {
          expr_toanyreg(fs,&val);
          bVar16 = false;
        }
        if (uStack_80 < 5) {
          expr_index(fs,e,(ExpDesc *)&local_88.field_2);
        }
        bcemit_store(fs,e,&val);
      }
      fs->freereg = local_6c;
      iVar9 = lex_opt(ls,0x2c);
    } while (iVar9 != 0);
    iVar9 = lex_opt(ls,0x3b);
  } while (iVar9 != 0);
LAB_00124dad:
  lex_match(ls,0x7d,0x7b,line);
  if (bVar16) {
    uVar10 = fs->pc - 1;
    pBVar17 = fs->bcbase + uVar10;
    local_88.u32.lo = uVar18 - 1;
    local_88.field_2.it = 0x43300000;
    uStack_80 = 4;
    uStack_7c = 0xffffffff;
    uStack_78 = 0xffffffff;
    if (0x100 < uVar18) {
      fs->pc = uVar10;
      pBVar17 = pBVar17 + -1;
    }
    uVar10 = local_6c << 8;
    BVar11 = const_num(fs,(ExpDesc *)&local_88.field_2);
    pBVar17->ins = BVar11 << 0x10 | uVar10 | 0x3f;
    *(undefined1 *)((long)&pBVar17[-1].ins + 3) = 0;
  }
  if (BVar5 == fs->pc - 1) {
    (e->u).s.info = BVar5;
    fs->freereg = fs->freereg - 1;
    EVar3 = VRELOCABLE;
  }
  else {
    EVar3 = VNONRELOC;
  }
  e->k = EVar3;
  if (gc == (GCobj *)0x0) {
    if (bVar4) {
      if (uVar18 < 3) {
        uVar10 = 3;
      }
      else {
        uVar10 = 0x7ff;
        if (uVar18 < 0x7ff) {
          uVar10 = uVar18;
        }
      }
    }
    else {
      uVar10 = 0;
    }
    if (uVar6 != 0) {
      if (uVar6 == 1) {
        uVar6 = 0x800;
      }
      else {
        uVar18 = 0x1f;
        if (uVar6 - 1 != 0) {
          for (; uVar6 - 1 >> uVar18 == 0; uVar18 = uVar18 - 1) {
          }
        }
        uVar6 = (uVar18 ^ 0x1f) * -0x800 + 0x10000;
      }
    }
    *(ushort *)((long)&fs->bcbase[BVar5].ins + 2) = (ushort)uVar6 | (ushort)uVar10;
  }
  else {
    if ((bVar4) && ((gc->pt).sizekgc < uVar18)) {
      lj_tab_reasize(fs->L,&gc->tab,uVar18 - 1);
    }
    if (local_70 != 0) {
      uVar6 = (gc->uv).dhash;
      MVar1 = (gc->pt).sizekn;
      for (lVar15 = 0; (ulong)(MVar1 + 1) * 0x18 - lVar15 != 0; lVar15 = lVar15 + 0x18) {
        if (*(int *)((ulong)uVar6 + 4 + lVar15) == -0xc) {
          *(undefined4 *)((ulong)uVar6 + 4 + lVar15) = 0xffffffff;
        }
      }
    }
    uVar14 = (ulong)(fs->L->glref).ptr32;
    if (*(uint *)(uVar14 + 0x54) <= *(uint *)(uVar14 + 0x50)) {
      lj_gc_step(fs->L);
    }
  }
  return;
}

Assistant:

static void expr_table(LexState *ls, ExpDesc *e)
{
  FuncState *fs = ls->fs;
  BCLine line = ls->linenumber;
  GCtab *t = NULL;
  int vcall = 0, needarr = 0, fixt = 0;
  uint32_t narr = 1;  /* First array index. */
  uint32_t nhash = 0;  /* Number of hash entries. */
  BCReg freg = fs->freereg;
  BCPos pc = bcemit_AD(fs, BC_TNEW, freg, 0);
  expr_init(e, VNONRELOC, freg);
  bcreg_reserve(fs, 1);
  freg++;
  lex_check(ls, '{');
  while (ls->tok != '}') {
    ExpDesc key, val;
    vcall = 0;
    if (ls->tok == '[') {
      expr_bracket(ls, &key);  /* Already calls expr_toval. */
      if (!expr_isk(&key)) expr_index(fs, e, &key);
      if (expr_isnumk(&key) && expr_numiszero(&key)) needarr = 1; else nhash++;
      lex_check(ls, '=');
    } else if ((ls->tok == TK_name || (!LJ_52 && ls->tok == TK_goto)) &&
	       lj_lex_lookahead(ls) == '=') {
      expr_str(ls, &key);
      lex_check(ls, '=');
      nhash++;
    } else {
      expr_init(&key, VKNUM, 0);
      setintV(&key.u.nval, (int)narr);
      narr++;
      needarr = vcall = 1;
    }
    expr(ls, &val);
    if (expr_isk(&key) && key.k != VKNIL &&
	(key.k == VKSTR || expr_isk_nojump(&val))) {
      TValue k, *v;
      if (!t) {  /* Create template table on demand. */
	BCReg kidx;
	t = lj_tab_new(fs->L, needarr ? narr : 0, hsize2hbits(nhash));
	kidx = const_gc(fs, obj2gco(t), LJ_TTAB);
	fs->bcbase[pc].ins = BCINS_AD(BC_TDUP, freg-1, kidx);
      }
      vcall = 0;
      expr_kvalue(fs, &k, &key);
      v = lj_tab_set(fs->L, t, &k);
      lj_gc_anybarriert(fs->L, t);
      if (expr_isk_nojump(&val)) {  /* Add const key/value to template table. */
	expr_kvalue(fs, v, &val);
      } else {  /* Otherwise create dummy string key (avoids lj_tab_newkey). */
	settabV(fs->L, v, t);  /* Preserve key with table itself as value. */
	fixt = 1;   /* Fix this later, after all resizes. */
	goto nonconst;
      }
    } else {
    nonconst:
      if (val.k != VCALL) { expr_toanyreg(fs, &val); vcall = 0; }
      if (expr_isk(&key)) expr_index(fs, e, &key);
      bcemit_store(fs, e, &val);
    }
    fs->freereg = freg;
    if (!lex_opt(ls, ',') && !lex_opt(ls, ';')) break;
  }
  lex_match(ls, '}', '{', line);
  if (vcall) {
    BCInsLine *ilp = &fs->bcbase[fs->pc-1];
    ExpDesc en;
    lj_assertFS(bc_a(ilp->ins) == freg &&
		bc_op(ilp->ins) == (narr > 256 ? BC_TSETV : BC_TSETB),
		"bad CALL code generation");
    expr_init(&en, VKNUM, 0);
    en.u.nval.u32.lo = narr-1;
    en.u.nval.u32.hi = 0x43300000;  /* Biased integer to avoid denormals. */
    if (narr > 256) { fs->pc--; ilp--; }
    ilp->ins = BCINS_AD(BC_TSETM, freg, const_num(fs, &en));
    setbc_b(&ilp[-1].ins, 0);
  }
  if (pc == fs->pc-1) {  /* Make expr relocable if possible. */
    e->u.s.info = pc;
    fs->freereg--;
    e->k = VRELOCABLE;
  } else {
    e->k = VNONRELOC;  /* May have been changed by expr_index. */
  }
  if (!t) {  /* Construct TNEW RD: hhhhhaaaaaaaaaaa. */
    BCIns *ip = &fs->bcbase[pc].ins;
    if (!needarr) narr = 0;
    else if (narr < 3) narr = 3;
    else if (narr > 0x7ff) narr = 0x7ff;
    setbc_d(ip, narr|(hsize2hbits(nhash)<<11));
  } else {
    if (needarr && t->asize < narr)
      lj_tab_reasize(fs->L, t, narr-1);
    if (fixt) {  /* Fix value for dummy keys in template table. */
      Node *node = noderef(t->node);
      uint32_t i, hmask = t->hmask;
      for (i = 0; i <= hmask; i++) {
	Node *n = &node[i];
	if (tvistab(&n->val)) {
	  lj_assertFS(tabV(&n->val) == t, "bad dummy key in template table");
	  setnilV(&n->val);  /* Turn value into nil. */
	}
      }
    }
    lj_gc_check(fs->L);
  }
}